

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Parser::parse_let_statement(Parser *this)

{
  string *__rhs;
  VM_Writer *this_00;
  bool bVar1;
  int index;
  ostream *poVar2;
  string segment;
  string identifier;
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  poVar2 = std::operator<<((ostream *)this->out_file,"\t\t\t<let_statement>");
  std::endl<char,std::char_traits<char>>(poVar2);
  __rhs = &this->cur_token;
  std::__cxx11::string::string((string *)&local_40,(string *)__rhs);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"IDENTIFIER",(allocator<char> *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"let statement",&local_a1);
  check_token_type_x_after_y(this,&local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  poVar2 = (ostream *)this->out_file;
  std::operator+(&local_a0,"\t\t\t\t<identifier>",__rhs);
  std::operator+(&local_80,&local_a0,"</identifier>");
  poVar2 = std::operator<<(poVar2,(string *)&local_80);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  query_tokenizer(this);
  Tokenizer::get_current_token_abi_cxx11_(&local_80,this->tokenizer);
  bVar1 = std::operator==(&local_80,"[");
  std::__cxx11::string::~string((string *)&local_80);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)this->out_file,"\t\t\t\t<symbol>[</symbol>");
    std::endl<char,std::char_traits<char>>(poVar2);
    query_tokenizer(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"INT_CONST",(allocator<char> *)&local_60);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"symbol",&local_a1);
    check_token_type_x_after_y(this,&local_80,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    poVar2 = (ostream *)this->out_file;
    std::operator+(&local_a0,"\t\t\t\t<int>",__rhs);
    std::operator+(&local_80,&local_a0,"</int>");
    poVar2 = std::operator<<(poVar2,(string *)&local_80);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    query_tokenizer(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"]",(allocator<char> *)&local_60);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"integer",&local_a1);
    check_expected_x_after_y(this,&local_80,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    poVar2 = (ostream *)this->out_file;
    std::operator+(&local_a0,"\t\t\t\t<symbol>",__rhs);
    std::operator+(&local_80,&local_a0,"</symbol>");
    poVar2 = std::operator<<(poVar2,(string *)&local_80);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    query_tokenizer(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"=",(allocator<char> *)&local_60);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"]",&local_a1);
    check_expected_x_after_y(this,&local_80,&local_a0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"=",(allocator<char> *)&local_60);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"identifier",&local_a1);
    check_expected_x_after_y(this,&local_80,&local_a0);
  }
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  poVar2 = std::operator<<((ostream *)this->out_file,"\t\t\t\t<symbol>=</symbol>");
  std::endl<char,std::char_traits<char>>(poVar2);
  query_tokenizer(this);
  parse_expression(this);
  poVar2 = (ostream *)this->out_file;
  std::operator+(&local_a0,"\t\t\t\t<symbol>",__rhs);
  std::operator+(&local_80,&local_a0,"</symbol>");
  poVar2 = std::operator<<(poVar2,(string *)&local_80);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  get_segment(&local_80,this,&local_40);
  bVar1 = std::operator==(&local_80,"none");
  if (!bVar1) {
    this_00 = this->vm_writer;
    get_segment(&local_a0,this,&local_40);
    index = Symbol_Table::get_index(&this->symbol_table,&local_40);
    VM_Writer::write_pop(this_00,&local_a0,index);
    std::__cxx11::string::~string((string *)&local_a0);
    poVar2 = std::operator<<((ostream *)this->out_file,"\t\t\t</let_statement>");
    std::endl<char,std::char_traits<char>>(poVar2);
    query_tokenizer(this);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
    return;
  }
  std::operator+(&local_60,"Identifier \'",&local_40);
  std::operator+(&local_a0,&local_60,"\' was not declared");
  poVar2 = std::operator<<((ostream *)&std::cerr,(string *)&local_a0);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_60);
  exit(0);
}

Assistant:

void Parser::parse_let_statement() {
    out_file << "\t\t\t<let_statement>" << std::endl;
    std::string identifier = cur_token;
    check_token_type_x_after_y("IDENTIFIER", "let statement");
    out_file << "\t\t\t\t<identifier>" + cur_token + "</identifier>" << std::endl;
    query_tokenizer();

    if (tokenizer.get_current_token() == "[") {
        out_file << "\t\t\t\t<symbol>[</symbol>" << std::endl;
        query_tokenizer();

        check_token_type_x_after_y("INT_CONST", "symbol");
        out_file << "\t\t\t\t<int>" + cur_token + "</int>" << std::endl;
        query_tokenizer();

        check_expected_x_after_y("]", "integer");
        out_file << "\t\t\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
        query_tokenizer();
        check_expected_x_after_y("=", "]");
    }
    else {
        check_expected_x_after_y("=", "identifier");
    }

    out_file << "\t\t\t\t<symbol>=</symbol>" << std::endl;
    query_tokenizer();

    parse_expression();

    out_file << "\t\t\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
    std::string segment = get_segment(identifier);
    if (segment == "none") {
        std::cerr << "Identifier '" + identifier  + "' was not declared" << std::endl;
        exit(0);
    }
    vm_writer.write_pop(get_segment(identifier), symbol_table.get_index(identifier));
    out_file << "\t\t\t</let_statement>" << std::endl;
    query_tokenizer();
}